

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O3

optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::get_address(optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *__return_storage_ptr__,
             Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
             *this,Root_vertex_handle global)

{
  dummy_u dVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> *res;
  _Base_ptr p_Var4;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  p_Var4 = (this->addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var3 = &(this->addresses)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (global.vertex <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < global.vertex];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var3) && ((int)p_Var2[1]._M_color <= global.vertex)) {
      dVar1 = *(dummy_u *)&p_Var2[1].field_0x4;
      (__return_storage_ptr__->super_type).m_initialized = true;
      (__return_storage_ptr__->super_type).m_storage.dummy_ = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Vertex_handle> get_address(Root_vertex_handle global) const {
    boost::optional < Vertex_handle > res;
    IdAddressMapConstIterator it = addresses.find(global);
    if (it == addresses.end())
      res.reset();
    else
      res = (*it).second;
    return res;
  }